

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

ElementTypeAndOffset * __thiscall
choc::value::Type::getElementTypeAndOffset
          (ElementTypeAndOffset *__return_storage_ptr__,Type *this,uint32_t index)

{
  MainType MVar1;
  uint uVar2;
  
  MVar1 = this->mainType;
  if (MVar1 < complexArray) {
    if (MVar1 == vector) {
      if ((this->content).vector.numElements <= index) {
LAB_001ea0ba:
        throwError("Index out of range");
      }
      MVar1 = (this->content).vector.elementType;
      (__return_storage_ptr__->elementType).mainType = MVar1;
      (__return_storage_ptr__->elementType).content.object = (Object *)0x0;
      (__return_storage_ptr__->elementType).allocator = (Allocator *)0x0;
      __return_storage_ptr__->offset = (ulong)index * (ulong)(MVar1 & 0xf);
    }
    else {
      if (MVar1 != primitiveArray) {
LAB_001ea0c6:
        throwError("Invalid type");
      }
      if ((this->content).vector.numElements <= index) goto LAB_001ea0ba;
      MVar1 = (this->content).vector.elementType;
      uVar2 = (this->content).primitiveArray.numVectorElements;
      if (uVar2 == 0) {
        (__return_storage_ptr__->elementType).mainType = MVar1;
        (__return_storage_ptr__->elementType).content.object = (Object *)0x0;
        (__return_storage_ptr__->elementType).allocator = (Allocator *)0x0;
        uVar2 = (MVar1 & 0xf) * index;
      }
      else {
        (__return_storage_ptr__->elementType).mainType = vector;
        (__return_storage_ptr__->elementType).content.object = (Object *)0x0;
        (__return_storage_ptr__->elementType).allocator = (Allocator *)0x0;
        if (0x100 < uVar2) {
          throwError("Too many vector elements");
        }
        (__return_storage_ptr__->elementType).content.vector.elementType = MVar1;
        (__return_storage_ptr__->elementType).content.vector.numElements = uVar2;
        uVar2 = (MVar1 & 0xf) * index * uVar2;
      }
      __return_storage_ptr__->offset = (ulong)uVar2;
    }
  }
  else if (MVar1 == complexArray) {
    ComplexArray::getElementInfo(__return_storage_ptr__,(this->content).complexArray,index);
  }
  else {
    if (MVar1 != object) goto LAB_001ea0c6;
    Object::getElementInfo(__return_storage_ptr__,(this->content).object,index);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ElementTypeAndOffset Type::getElementTypeAndOffset (uint32_t index) const
{
    if (isType (MainType::vector))          return content.vector.getElementInfo (index);
    if (isType (MainType::primitiveArray))  return content.primitiveArray.getElementInfo (index);
    if (isType (MainType::complexArray))    return content.complexArray->getElementInfo (index);
    if (isType (MainType::object))          return content.object->getElementInfo (index);

    throwError ("Invalid type");
}